

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting_window.cpp
# Opt level: O0

void count_set_proc(Am_Object *cmd)

{
  int value;
  Am_Value *pAVar1;
  ostream *poVar2;
  void *pvVar3;
  int val;
  Am_Object local_20;
  Am_Object execute_cmd;
  Am_Object counter_widget;
  Am_Object *cmd_local;
  
  pAVar1 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&execute_cmd,pAVar1);
  Am_Object::Get_Sibling(&local_20,(Am_Slot_Key)&execute_cmd,(ulong)Am_SCRIPT_EXECUTE_COMMAND);
  pAVar1 = Am_Object::Get(cmd,0x169,0);
  value = Am_Value::operator_cast_to_int(pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Setting count of ");
  poVar2 = operator<<(poVar2,&local_20);
  poVar2 = std::operator<<(poVar2," to ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,value);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  Am_Object::Set(&local_20,Am_EXECUTE_COUNTER,value,0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&execute_cmd);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, count_set, (Am_Object cmd))
{
  Am_Object counter_widget = cmd.Get(Am_SAVED_OLD_OWNER);
  Am_Object execute_cmd = counter_widget.Get_Sibling(Am_SCRIPT_EXECUTE_COMMAND);
  int val = cmd.Get(Am_VALUE);
  std::cout << "Setting count of " << execute_cmd << " to " << val << std::endl
            << std::flush;
  execute_cmd.Set(Am_EXECUTE_COUNTER, val);
}